

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::ProcessStatsConfig::ParseFromArray
          (ProcessStatsConfig *this,void *raw,size_t size)

{
  pointer pPVar1;
  uint64_t uVar2;
  undefined1 uVar3;
  uint uVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t *end;
  ulong uVar11;
  uint64_t int_value;
  uint64_t payload_length;
  uint64_t preamble;
  uint32_t local_60;
  ushort local_5c;
  uint8_t local_5a;
  ProcessStatsConfig *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  *local_48;
  bitset<7UL> *local_40;
  uint64_t payload_length_1;
  
  pPVar1 = (this->quirks_).
           super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->quirks_).
      super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar1) {
    (this->quirks_).
    super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  local_48 = &this->quirks_;
  local_50 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar10 = 0;
  local_58 = this;
  while( true ) {
    if (end <= raw) {
      uVar8 = 0;
      goto LAB_002bab3b;
    }
    preamble = 0;
    if ((long)(char)*raw < 0) break;
    puVar7 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002ba9f5:
    uVar2 = preamble;
    uVar11 = preamble >> 3;
    uVar4 = (uint)uVar11;
    if ((uVar4 == 0) || (end <= puVar7)) goto LAB_002bad8f;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar6 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar7,(uint8_t *)end,&int_value);
      uVar9 = 0;
      uVar8 = 0;
      if (puVar6 == puVar7) goto LAB_002bab3b;
      break;
    case 1:
      puVar6 = puVar7 + 1;
      if (end < puVar6) goto switchD_002baa2c_caseD_3;
      int_value = *puVar7;
LAB_002baa76:
      uVar9 = 0;
      break;
    case 2:
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar7,(uint8_t *)end,&payload_length)
      ;
      if ((puVar5 == puVar7) || ((ulong)((long)end - (long)puVar5) < payload_length))
      goto switchD_002baa2c_caseD_3;
      puVar6 = (uint64_t *)((long)puVar5 + payload_length);
      uVar9 = payload_length;
      int_value = (uint64_t)puVar5;
      break;
    default:
      goto switchD_002baa2c_caseD_3;
    case 5:
      puVar6 = (uint64_t *)((long)puVar7 + 4);
      if (puVar6 <= end) {
        int_value = (uint64_t)(uint)*puVar7;
        goto LAB_002baa76;
      }
      goto switchD_002baa2c_caseD_3;
    }
    raw = puVar6;
    if ((uVar4 < 0x10000) && (uVar9 < 0x10000000)) {
      uVar10 = uVar9 | (uVar2 & 7) << 0x30 | uVar11 << 0x20;
      uVar8 = int_value;
LAB_002bab3b:
      local_40 = &local_58->_has_field_;
LAB_002bab4c:
      do {
        preamble = uVar8;
        local_60 = (uint32_t)uVar10;
        local_5a = (uint8_t)(uVar10 >> 0x30);
        uVar4 = (uint)(uVar10 >> 0x20);
        local_5c = (ushort)(uVar10 >> 0x20);
        if (local_5c == 0) {
          return end == (uint64_t *)raw;
        }
        if (local_5c < 7) {
          std::bitset<7UL>::set(local_40,(ulong)(uVar4 & 7),true);
          uVar4 = (uint)local_5c;
        }
        uVar4 = (uVar4 & 0xffff) - 1;
        if (uVar4 < 6) {
          uVar3 = (*(code *)(&DAT_00379b30 + *(int *)(&DAT_00379b30 + (ulong)uVar4 * 4)))();
          return (bool)uVar3;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  ((Field *)&preamble,local_50);
        do {
          if (end <= raw) {
            uVar10 = 0;
            uVar8 = 0;
            goto LAB_002bab4c;
          }
          int_value = 0;
          if ((long)(char)*raw < 0) {
            puVar7 = (uint64_t *)
                     protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
            if (puVar7 != (uint64_t *)raw) goto LAB_002bac24;
LAB_002bad65:
            uVar10 = 0;
            uVar8 = 0;
            goto LAB_002bab4c;
          }
          puVar7 = (uint64_t *)((long)raw + 1);
          int_value = (long)(char)*raw;
LAB_002bac24:
          uVar2 = int_value;
          uVar11 = int_value >> 3;
          uVar4 = (uint)uVar11;
          if ((uVar4 == 0) || (end <= puVar7)) goto LAB_002bad65;
          payload_length = 0;
          switch((uint)int_value & 7) {
          case 0:
            puVar6 = (uint64_t *)
                     protozero::proto_utils::ParseVarInt
                               ((uint8_t *)puVar7,(uint8_t *)end,&payload_length);
            uVar9 = 0;
            uVar10 = 0;
            uVar8 = 0;
            if (puVar6 == puVar7) goto LAB_002bab4c;
            break;
          case 1:
            puVar6 = puVar7 + 1;
            if (end < puVar6) goto switchD_002bac62_caseD_3;
            payload_length = *puVar7;
LAB_002bacb9:
            uVar9 = 0;
            break;
          case 2:
            puVar5 = (uint64_t *)
                     protozero::proto_utils::ParseVarInt
                               ((uint8_t *)puVar7,(uint8_t *)end,&payload_length_1);
            if ((puVar5 == puVar7) || ((ulong)((long)end - (long)puVar5) < payload_length_1))
            goto switchD_002bac62_caseD_3;
            puVar6 = (uint64_t *)((long)puVar5 + payload_length_1);
            uVar9 = payload_length_1;
            payload_length = (uint64_t)puVar5;
            break;
          default:
            goto switchD_002bac62_caseD_3;
          case 5:
            puVar6 = (uint64_t *)((long)puVar7 + 4);
            if (puVar6 <= end) {
              payload_length = (uint64_t)(uint)*puVar7;
              goto LAB_002bacb9;
            }
            goto switchD_002bac62_caseD_3;
          }
          raw = puVar6;
        } while ((0xffff < uVar4) || (0xfffffff < uVar9));
        uVar10 = uVar9 | (uVar2 & 7) << 0x30 | uVar11 << 0x20;
        uVar8 = payload_length;
      } while( true );
    }
  }
  puVar7 = (uint64_t *)protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
  if (puVar7 != (uint64_t *)raw) goto LAB_002ba9f5;
LAB_002bad8f:
  uVar10 = 0;
  uVar8 = 0;
  goto LAB_002bab3b;
switchD_002baa2c_caseD_3:
  uVar10 = 0;
  uVar8 = 0;
  goto LAB_002bab3b;
switchD_002bac62_caseD_3:
  uVar10 = 0;
  uVar8 = 0;
  goto LAB_002bab4c;
}

Assistant:

bool ProcessStatsConfig::ParseFromArray(const void* raw, size_t size) {
  quirks_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* quirks */:
        quirks_.emplace_back();
        field.get(&quirks_.back());
        break;
      case 2 /* scan_all_processes_on_start */:
        field.get(&scan_all_processes_on_start_);
        break;
      case 3 /* record_thread_names */:
        field.get(&record_thread_names_);
        break;
      case 4 /* proc_stats_poll_ms */:
        field.get(&proc_stats_poll_ms_);
        break;
      case 6 /* proc_stats_cache_ttl_ms */:
        field.get(&proc_stats_cache_ttl_ms_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}